

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t process_head_file_extra(archive_read *a,archive_entry *e,rar5 *rar,ssize_t extra_data_size)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  archive_entry *paVar4;
  uint64_t uVar5;
  uint64_t *puVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  char *pcVar9;
  char *pcVar10;
  uint64_t uVar11;
  undefined8 *puVar12;
  void *pvVar13;
  int64_t iVar14;
  char *pcVar15;
  byte unix_time;
  long lVar16;
  uint64_t v_4;
  uint64_t value_size;
  uint64_t flags;
  uint64_t id;
  uint64_t v;
  long local_20c0;
  archive_string local_20b8;
  archive_entry *local_2098;
  uint64_t local_2090;
  uint64_t local_2088;
  uint64_t local_2080;
  uint64_t *local_2078;
  uint64_t *local_2070;
  uint8_t *local_2068;
  rar5 *local_2060;
  uint32_t *local_2058;
  uint64_t *local_2050;
  uint64_t *local_2048;
  uint64_t *local_2040;
  archive_string local_2038 [341];
  
  if (extra_data_size < 1) {
    wVar7 = L'\xffffffe2';
  }
  else {
    local_2070 = &(rar->file).redir_type;
    local_2078 = &(rar->file).redir_flags;
    local_2040 = &(rar->file).e_mtime;
    local_2048 = &(rar->file).e_ctime;
    local_2050 = &(rar->file).e_atime;
    local_2058 = &(rar->file).e_unix_ns;
    local_2068 = (rar->file).blake2sp;
    local_20c0 = extra_data_size;
    local_2098 = e;
    local_2060 = rar;
    do {
      lVar16 = local_20c0;
      local_20b8.s = (char *)0x0;
      wVar7 = read_var(a,(uint64_t *)local_2038,(uint64_t *)&local_20b8);
      pcVar15 = local_20b8.s;
      if (wVar7 == L'\0') {
        return L'\x01';
      }
      lVar16 = lVar16 - (long)local_20b8.s;
      local_20c0 = lVar16;
      pcVar9 = (char *)__archive_read_consume(a,(int64_t)local_20b8.s);
      if (pcVar9 != pcVar15) {
        return L'\x01';
      }
      local_20b8.s = (char *)0x0;
      wVar7 = read_var(a,(uint64_t *)local_2038,(uint64_t *)&local_20b8);
      pcVar9 = local_2038[0].s;
      pcVar15 = local_20b8.s;
      if (wVar7 == L'\0') {
        return L'\x01';
      }
      lVar16 = lVar16 - (long)local_20b8.s;
      local_20c0 = lVar16;
      pcVar10 = (char *)__archive_read_consume(a,(int64_t)local_20b8.s);
      if (pcVar10 != pcVar15) {
        return L'\x01';
      }
      switch(pcVar9) {
      case (char *)0x2:
        local_20b8.s = (char *)0x0;
        wVar8 = read_var(a,(uint64_t *)local_2038,(uint64_t *)&local_20b8);
        pcVar15 = local_20b8.s;
        pcVar9 = (char *)0x0;
        if (wVar8 != L'\0') {
          pcVar9 = local_2038[0].s;
        }
        wVar7 = L'\x01';
        if (wVar8 != L'\0') {
          lVar16 = lVar16 - (long)local_20b8.s;
          local_20c0 = lVar16;
          pcVar10 = (char *)__archive_read_consume(a,(int64_t)local_20b8.s);
          if (pcVar10 == pcVar15) {
            if (pcVar9 == (char *)0x0) {
              local_2038[0].s = (char *)0xffffffffffffffff;
              puVar12 = (undefined8 *)__archive_read_ahead(a,0x20,(ssize_t *)local_2038);
              if (puVar12 != (undefined8 *)0x0) {
                (local_2060->file).has_blake2 = '\x01';
                uVar1 = *puVar12;
                uVar2 = puVar12[1];
                uVar3 = puVar12[3];
                *(undefined8 *)(local_2068 + 0x10) = puVar12[2];
                *(undefined8 *)(local_2068 + 0x18) = uVar3;
                *(undefined8 *)local_2068 = uVar1;
                *(undefined8 *)(local_2068 + 8) = uVar2;
                iVar14 = __archive_read_consume(a,0x20);
                if (iVar14 == 0x20) {
                  local_20c0 = lVar16 + -0x20;
                  goto LAB_00639e46;
                }
              }
            }
            else {
              archive_set_error(&a->archive,0x54,"Unsupported hash type (0x%x)");
LAB_0063988c:
              wVar7 = L'\xffffffe2';
            }
          }
        }
        break;
      case (char *)0x3:
        local_20b8.s = (char *)0x0;
        wVar8 = read_var(a,(uint64_t *)local_2038,(uint64_t *)&local_20b8);
        pcVar15 = local_20b8.s;
        pcVar9 = (char *)0x0;
        if (wVar8 != L'\0') {
          pcVar9 = local_2038[0].s;
        }
        wVar7 = L'\x01';
        if (wVar8 != L'\0') {
          local_20c0 = lVar16 - (long)local_20b8.s;
          pcVar10 = (char *)__archive_read_consume(a,(int64_t)local_20b8.s);
          puVar6 = local_2040;
          if (pcVar10 == pcVar15) {
            unix_time = (byte)pcVar9 & 1;
            if (((ulong)pcVar9 & 2) != 0) {
              parse_htime_item(a,unix_time,local_2040,&local_20c0);
              archive_entry_set_mtime(local_2098,*puVar6,0);
            }
            puVar6 = local_2048;
            if (((ulong)pcVar9 & 4) != 0) {
              parse_htime_item(a,unix_time,local_2048,&local_20c0);
              archive_entry_set_ctime(local_2098,*puVar6,0);
            }
            puVar6 = local_2050;
            if (((ulong)pcVar9 & 8) != 0) {
              parse_htime_item(a,unix_time,local_2050,&local_20c0);
              archive_entry_set_atime(local_2098,*puVar6,0);
            }
            if (((ulong)pcVar9 & 0x10) == 0) {
              wVar7 = L'\0';
            }
            else {
              wVar8 = read_u32(a,local_2058);
              if (wVar8 != L'\0') {
                local_20c0 = local_20c0 + -4;
                goto LAB_00639e46;
              }
            }
          }
        }
        break;
      case (char *)0x4:
        local_20b8.s = (char *)0x0;
        wVar8 = read_var(a,(uint64_t *)local_2038,(uint64_t *)&local_20b8);
        pcVar15 = local_20b8.s;
        wVar7 = L'\x01';
        if (wVar8 != L'\0') {
          lVar16 = lVar16 - (long)local_20b8.s;
          local_20c0 = lVar16;
          pcVar9 = (char *)__archive_read_consume(a,(int64_t)local_20b8.s);
          if (pcVar9 == pcVar15) {
            local_20b8.s = (char *)0x0;
            wVar8 = read_var(a,(uint64_t *)local_2038,(uint64_t *)&local_20b8);
            pcVar9 = local_2038[0].s;
            pcVar15 = local_20b8.s;
            if (wVar8 != L'\0') {
              local_20c0 = lVar16 - (long)local_20b8.s;
              pcVar10 = (char *)__archive_read_consume(a,(int64_t)local_20b8.s);
              paVar4 = local_2098;
              if (pcVar10 == pcVar15) {
                pcVar15 = archive_entry_pathname_utf8(local_2098);
                if (pcVar15 == (char *)0x0) {
                  archive_set_error(&a->archive,0x16,"Version entry without file name");
                  goto LAB_0063988c;
                }
                local_2038[0].s = (char *)0x0;
                local_2038[0].length = 0;
                wVar7 = L'\0';
                local_2038[0].buffer_length = 0;
                local_20b8.s = (char *)0x0;
                local_20b8.length = 0;
                local_20b8.buffer_length = 0;
                archive_string_sprintf(local_2038,";%zu",pcVar9);
                archive_strcat(&local_20b8,pcVar15);
                archive_strcat(&local_20b8,local_2038[0].s);
                archive_entry_update_pathname_utf8(paVar4,local_20b8.s);
                archive_string_free(local_2038);
                archive_string_free(&local_20b8);
              }
            }
          }
        }
        break;
      case (char *)0x5:
        local_20b8.s = (char *)0x0;
        wVar8 = read_var(a,local_2070,(uint64_t *)&local_20b8);
        pcVar15 = local_20b8.s;
        wVar7 = L'\x01';
        if ((wVar8 != L'\0') &&
           (pcVar9 = (char *)__archive_read_consume(a,(int64_t)local_20b8.s), pcVar9 == pcVar15)) {
          lVar16 = lVar16 - (long)local_20b8.s;
          local_20c0 = lVar16;
          wVar8 = read_var(a,local_2078,(uint64_t *)&local_20b8);
          pcVar15 = local_20b8.s;
          if ((wVar8 != L'\0') &&
             (pcVar9 = (char *)__archive_read_consume(a,(int64_t)local_20b8.s), pcVar9 == pcVar15))
          {
            lVar16 = lVar16 - (long)local_20b8.s;
            local_20c0 = lVar16;
            wVar8 = read_var(a,(uint64_t *)local_2038,(uint64_t *)0x0);
            pcVar15 = local_2038[0].s;
            if (wVar8 != L'\0') {
              local_20c0 = lVar16 + ~(ulong)local_2038[0].s;
              local_2038[0].s = (char *)0xffffffffffffffff;
              pvVar13 = __archive_read_ahead(a,(size_t)pcVar15,(ssize_t *)local_2038);
              if (pvVar13 != (void *)0x0) {
                if (pcVar15 < (char *)0x800) {
                  if (pcVar15 != (char *)0x0) {
                    memcpy(local_2038,pvVar13,(size_t)pcVar15);
                    pcVar15[(long)&local_2038[0].s] = '\0';
                    pcVar9 = (char *)__archive_read_consume(a,(int64_t)pcVar15);
                    paVar4 = local_2098;
                    if (pcVar9 == pcVar15) {
                      wVar7 = L'\0';
                      if (*local_2070 - 1 < 2) {
                        archive_entry_set_filetype(local_2098,0xa000);
                        archive_entry_update_symlink_utf8(paVar4,(char *)local_2038);
                        if ((*local_2078 & 1) == 0) {
                          wVar8 = L'\x01';
                        }
                        else {
                          wVar8 = L'\x02';
                        }
                        archive_entry_set_symlink_type(paVar4,wVar8);
                      }
                      else if (*local_2070 == 4) {
                        archive_entry_set_filetype(local_2098,0x8000);
                        archive_entry_update_hardlink_utf8(paVar4,(char *)local_2038);
                        wVar7 = L'\0';
                      }
                    }
                    break;
                  }
                  pcVar15 = "No link target specified";
                }
                else {
                  pcVar15 = "Link target is too long";
                }
                archive_set_error(&a->archive,0x54,pcVar15);
                wVar7 = L'\xffffffe2';
              }
            }
          }
        }
        break;
      case (char *)0x6:
        local_2088 = 0;
        local_2090 = 0;
        local_2080 = 0;
        wVar8 = read_var(a,&local_2088,&local_2090);
        uVar5 = local_2090;
        wVar7 = L'\x01';
        if ((wVar8 != L'\0') && (uVar11 = __archive_read_consume(a,local_2090), uVar11 == uVar5)) {
          lVar16 = lVar16 - local_2090;
          local_20c0 = lVar16;
          if ((local_2088 & 1) == 0) {
LAB_006398f7:
            if ((local_2088 & 2) == 0) {
LAB_00639902:
              if ((local_2088 & 4) != 0) {
                wVar8 = read_var(a,&local_2080,&local_2090);
                uVar5 = local_2090;
                if ((wVar8 == L'\0') ||
                   (uVar11 = __archive_read_consume(a,local_2090), uVar11 != uVar5)) break;
                local_20c0 = local_20c0 - local_2090;
                archive_entry_set_uid(local_2098,local_2080);
              }
              if ((local_2088 & 8) != 0) {
                wVar8 = read_var(a,&local_2080,&local_2090);
                uVar5 = local_2090;
                if ((wVar8 == L'\0') ||
                   (uVar11 = __archive_read_consume(a,local_2090), uVar11 != uVar5)) break;
                local_20c0 = local_20c0 - local_2090;
                archive_entry_set_gid(local_2098,local_2080);
              }
LAB_00639e46:
              wVar7 = L'\0';
            }
            else {
              wVar8 = read_var(a,(uint64_t *)&local_20b8,(uint64_t *)0x0);
              pcVar15 = local_20b8.s;
              if (wVar8 != L'\0') {
                local_20c0 = local_20c0 + ~(ulong)local_20b8.s;
                local_20b8.s = (char *)0xffffffffffffffff;
                pvVar13 = __archive_read_ahead(a,(size_t)pcVar15,(ssize_t *)&local_20b8);
                if (pvVar13 != (void *)0x0) {
                  pcVar9 = (char *)0xff;
                  if (pcVar15 < (char *)0xff) {
                    pcVar9 = pcVar15;
                  }
                  memcpy(local_2038,pvVar13,(size_t)pcVar9);
                  pcVar9[(long)&local_2038[0].s] = '\0';
                  pcVar9 = (char *)__archive_read_consume(a,(int64_t)pcVar15);
                  if (pcVar9 == pcVar15) {
                    archive_entry_set_gname(local_2098,(char *)local_2038);
                    goto LAB_00639902;
                  }
                }
              }
            }
          }
          else {
            wVar8 = read_var(a,(uint64_t *)local_2038,(uint64_t *)0x0);
            pcVar15 = local_2038[0].s;
            if (wVar8 != L'\0') {
              local_20c0 = lVar16 + ~(ulong)local_2038[0].s;
              local_2038[0].s = (char *)0xffffffffffffffff;
              pvVar13 = __archive_read_ahead(a,(size_t)pcVar15,(ssize_t *)local_2038);
              if (pvVar13 != (void *)0x0) {
                pcVar9 = (char *)0xff;
                if (pcVar15 < (char *)0xff) {
                  pcVar9 = pcVar15;
                }
                memcpy(local_2038,pvVar13,(size_t)pcVar9);
                pcVar9[(long)&local_2038[0].s] = '\0';
                pcVar9 = (char *)__archive_read_consume(a,(int64_t)pcVar15);
                if (pcVar9 == pcVar15) {
                  archive_entry_set_uname(local_2098,(char *)local_2038);
                  goto LAB_006398f7;
                }
              }
            }
          }
        }
        break;
      default:
        iVar14 = __archive_read_consume(a,lVar16);
        if (iVar14 == lVar16) {
          return L'\0';
        }
        return L'\xffffffe2';
      }
    } while (0 < local_20c0);
  }
  return wVar7;
}

Assistant:

static int process_head_file_extra(struct archive_read* a,
    struct archive_entry* e, struct rar5* rar, ssize_t extra_data_size)
{
	size_t extra_field_size;
	size_t extra_field_id = 0;
	int ret = ARCHIVE_FATAL;
	size_t var_size;

	while(extra_data_size > 0) {
		if(!read_var_sized(a, &extra_field_size, &var_size))
			return ARCHIVE_EOF;

		extra_data_size -= var_size;
		if(ARCHIVE_OK != consume(a, var_size)) {
			return ARCHIVE_EOF;
		}

		if(!read_var_sized(a, &extra_field_id, &var_size))
			return ARCHIVE_EOF;

		extra_data_size -= var_size;
		if(ARCHIVE_OK != consume(a, var_size)) {
			return ARCHIVE_EOF;
		}

		switch(extra_field_id) {
			case EX_HASH:
				ret = parse_file_extra_hash(a, rar,
				    &extra_data_size);
				break;
			case EX_HTIME:
				ret = parse_file_extra_htime(a, e, rar,
				    &extra_data_size);
				break;
			case EX_REDIR:
				ret = parse_file_extra_redir(a, e, rar,
				    &extra_data_size);
				break;
			case EX_UOWNER:
				ret = parse_file_extra_owner(a, e,
				    &extra_data_size);
				break;
			case EX_VERSION:
				ret = parse_file_extra_version(a, e,
				    &extra_data_size);
				break;
			case EX_CRYPT:
				/* fallthrough */
			case EX_SUBDATA:
				/* fallthrough */
			default:
				/* Skip unsupported entry. */
				return consume(a, extra_data_size);
		}
	}

	if(ret != ARCHIVE_OK) {
		/* Attribute not implemented. */
		return ret;
	}

	return ARCHIVE_OK;
}